

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes3InfoTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::RenderTargetInfoCase::iterate(RenderTargetInfoCase *this)

{
  int iVar1;
  TestLog *pTVar2;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  LogNumber<long> local_7e0;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  LogNumber<long> local_6f8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  LogNumber<long> local_610;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  LogNumber<long> local_528;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  LogNumber<long> local_440;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  LogNumber<long> local_358;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  LogNumber<long> local_270;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  LogNumber<long> local_188;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_b1;
  string local_b0;
  LogNumber<long> local_90;
  PixelFormat *local_20;
  PixelFormat *pf;
  RenderTarget *rt;
  RenderTargetInfoCase *this_local;
  
  rt = (RenderTarget *)this;
  pf = (PixelFormat *)Context::getRenderTarget((this->super_TestCase).m_context);
  local_20 = tcu::RenderTarget::getPixelFormat((RenderTarget *)pf);
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"RedBits",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Red channel bits",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  tcu::LogNumber<long>::LogNumber
            (&local_90,&local_b0,&local_e8,&local_110,QP_KEY_TAG_NONE,(long)local_20->redBits);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"GreenBits",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Green channel bits",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  tcu::LogNumber<long>::LogNumber
            (&local_188,&local_1a8,&local_1d0,&local_1f8,QP_KEY_TAG_NONE,(long)local_20->greenBits);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"BlueBits",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"Blue channel bits",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
  tcu::LogNumber<long>::LogNumber
            (&local_270,&local_290,&local_2b8,&local_2e0,QP_KEY_TAG_NONE,(long)local_20->blueBits);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"AlphaBits",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"Alpha channel bits",&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"",&local_3c9);
  tcu::LogNumber<long>::LogNumber
            (&local_358,&local_378,&local_3a0,&local_3c8,QP_KEY_TAG_NONE,(long)local_20->alphaBits);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"DepthBits",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"Depth bits",&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"",&local_4b1);
  iVar1 = tcu::RenderTarget::getDepthBits((RenderTarget *)pf);
  tcu::LogNumber<long>::LogNumber
            (&local_440,&local_460,&local_488,&local_4b0,QP_KEY_TAG_NONE,(long)iVar1);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"StencilBits",&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"Stencil bits",&local_571)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"",&local_599);
  iVar1 = tcu::RenderTarget::getStencilBits((RenderTarget *)pf);
  tcu::LogNumber<long>::LogNumber
            (&local_528,&local_548,&local_570,&local_598,QP_KEY_TAG_NONE,(long)iVar1);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_528);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"NumSamples",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"Number of samples",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"",&local_681);
  iVar1 = tcu::RenderTarget::getNumSamples((RenderTarget *)pf);
  tcu::LogNumber<long>::LogNumber
            (&local_610,&local_630,&local_658,&local_680,QP_KEY_TAG_NONE,(long)iVar1);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"Width",&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"Width",&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"",&local_769);
  iVar1 = tcu::RenderTarget::getWidth((RenderTarget *)pf);
  tcu::LogNumber<long>::LogNumber
            (&local_6f8,&local_718,&local_740,&local_768,QP_KEY_TAG_NONE,(long)iVar1);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"Height",&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"Height",&local_829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"",&local_851);
  iVar1 = tcu::RenderTarget::getHeight((RenderTarget *)pf);
  tcu::LogNumber<long>::LogNumber
            (&local_7e0,&local_800,&local_828,&local_850,QP_KEY_TAG_NONE,(long)iVar1);
  tcu::TestLog::operator<<(pTVar2,&local_7e0);
  tcu::LogNumber<long>::~LogNumber(&local_7e0);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  std::__cxx11::string::~string((string *)&local_828);
  std::allocator<char>::~allocator(&local_829);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  tcu::LogNumber<long>::~LogNumber(&local_6f8);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  tcu::LogNumber<long>::~LogNumber(&local_610);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  tcu::LogNumber<long>::~LogNumber(&local_528);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  tcu::LogNumber<long>::~LogNumber(&local_440);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  tcu::LogNumber<long>::~LogNumber(&local_358);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  tcu::LogNumber<long>::~LogNumber(&local_270);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  tcu::LogNumber<long>::~LogNumber(&local_188);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  tcu::LogNumber<long>::~LogNumber(&local_90);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const tcu::RenderTarget&	rt		= m_context.getRenderTarget();
		const tcu::PixelFormat&		pf		= rt.getPixelFormat();

		m_testCtx.getLog()
			<< tcu::TestLog::Integer("RedBits",		"Red channel bits",		"", QP_KEY_TAG_NONE,	pf.redBits)
			<< tcu::TestLog::Integer("GreenBits",	"Green channel bits",	"",	QP_KEY_TAG_NONE,	pf.greenBits)
			<< tcu::TestLog::Integer("BlueBits",	"Blue channel bits",	"",	QP_KEY_TAG_NONE,	pf.blueBits)
			<< tcu::TestLog::Integer("AlphaBits",	"Alpha channel bits",	"",	QP_KEY_TAG_NONE,	pf.alphaBits)
			<< tcu::TestLog::Integer("DepthBits",	"Depth bits",			"",	QP_KEY_TAG_NONE,	rt.getDepthBits())
			<< tcu::TestLog::Integer("StencilBits",	"Stencil bits",			"",	QP_KEY_TAG_NONE,	rt.getStencilBits())
			<< tcu::TestLog::Integer("NumSamples",	"Number of samples",	"",	QP_KEY_TAG_NONE,	rt.getNumSamples())
			<< tcu::TestLog::Integer("Width",		"Width",				"",	QP_KEY_TAG_NONE,	rt.getWidth())
			<< tcu::TestLog::Integer("Height",		"Height",				"",	QP_KEY_TAG_NONE,	rt.getHeight());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}